

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long *local_50 [2];
  long local_40 [2];
  
  if (2 < current->_M_string_length) {
    bVar1 = false;
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)current);
    iVar2 = ::std::__cxx11::string::compare((char *)local_50);
    if (iVar2 == 0) {
      bVar1 = valid_first_char<char>((current->_M_dataplus)._M_p[2]);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (bVar1 != false) {
      lVar3 = ::std::__cxx11::string::find((char)current,0x3d);
      if (lVar3 == -1) {
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        ::std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,0x145047);
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)current);
        ::std::__cxx11::string::operator=((string *)value,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

inline bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.substr(0, 2) == "--" && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}